

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

FlatFilePos __thiscall
node::BlockManager::SaveBlockToDisk(BlockManager *this,CBlock *block,int nHeight)

{
  Notifications *pNVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  FlatFilePos blockPos;
  SizeComputer local_78;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_70;
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.m_params = &::TX_WITH_WITNESS;
  local_70.m_substream = &local_78;
  local_78.nSize = 0x50;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            ((VectorFormatter<DefaultFormatter> *)&blockPos,&local_70,&block->vtx);
  blockPos = FindNextBlockPos(this,(int)local_78.nSize + 8,nHeight,
                              (ulong)(block->super_CBlockHeader).nTime);
  if (blockPos.nFile == -1) {
    logging_function._M_str = "SaveBlockToDisk";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    LogPrintFormatInternal<char[16]>
              (logging_function,source_file,0x46a,ALL,Error,(ConstevalFormatString<1U>)0x7d7db8,
               (char (*) [16])"SaveBlockToDisk");
  }
  else {
    bVar2 = WriteBlockToDisk(this,block,&blockPos);
    if (bVar2) {
      uVar3 = (ulong)blockPos & 0xffffffff00000000;
      uVar4 = (ulong)blockPos & 0xffffffff;
      goto LAB_0020c0af;
    }
    pNVar1 = (this->m_opts).notifications;
    local_70.m_params = (TransactionSerParams *)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Failed to write block.","")
    ;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Failed to write block.","");
    }
    else {
      local_78.nSize = 0x7d7dd5;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_50,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_78);
    }
    (*pNVar1->_vptr_Notifications[8])(pNVar1,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70.m_params != (TransactionSerParams *)local_60) {
      operator_delete(local_70.m_params,local_60[0] + 1);
    }
  }
  uVar4 = 0xffffffff;
  uVar3 = 0;
LAB_0020c0af:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (FlatFilePos)(uVar3 | uVar4);
}

Assistant:

FlatFilePos BlockManager::SaveBlockToDisk(const CBlock& block, int nHeight)
{
    unsigned int nBlockSize = ::GetSerializeSize(TX_WITH_WITNESS(block));
    // Account for the 4 magic message start bytes + the 4 length bytes (8 bytes total,
    // defined as BLOCK_SERIALIZATION_HEADER_SIZE)
    nBlockSize += static_cast<unsigned int>(BLOCK_SERIALIZATION_HEADER_SIZE);
    FlatFilePos blockPos{FindNextBlockPos(nBlockSize, nHeight, block.GetBlockTime())};
    if (blockPos.IsNull()) {
        LogError("%s: FindNextBlockPos failed\n", __func__);
        return FlatFilePos();
    }
    if (!WriteBlockToDisk(block, blockPos)) {
        m_opts.notifications.fatalError(_("Failed to write block."));
        return FlatFilePos();
    }
    return blockPos;
}